

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

AV1_PRIMARY *
av1_create_primary_compressor
          (aom_codec_pkt_list *pkt_list_head,int num_lap_buffers,AV1EncoderConfig *oxcf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  _Bool _Var4;
  char cVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  aom_transfer_characteristics_t aVar8;
  int iVar9;
  AV1_PRIMARY *ppi_00;
  double *pdVar10;
  uint uVar11;
  uint uVar12;
  AV1_PRIMARY *ppi;
  
  ppi_00 = (AV1_PRIMARY *)aom_memalign(0x20,0x14e38);
  if (ppi_00 == (AV1_PRIMARY *)0x0) {
    return (AV1_PRIMARY *)0x0;
  }
  memset(ppi_00,0,0x14e38);
  iVar9 = _setjmp((__jmp_buf_tag *)(ppi_00->error).jmp);
  if (iVar9 != 0) {
    (ppi_00->error).setjmp = 0;
    av1_remove_primary_compressor(ppi_00);
    return (AV1_PRIMARY *)0x0;
  }
  (ppi_00->error).setjmp = 1;
  ppi_00->seq_params_locked = 0;
  ppi_00->lap_enabled = (uint)(0 < num_lap_buffers);
  ppi_00->output_pkt_list = pkt_list_head;
  ppi_00->b_calculate_psnr = 0;
  ppi_00->frames_left = (oxcf->input_cfg).limit;
  ppi_00->num_fp_contexts = 1;
  ppi_00->use_svc = 0;
  ppi_00->number_temporal_layers = 1;
  ppi_00->number_spatial_layers = 1;
  (ppi_00->seq_params).profile = oxcf->profile;
  (ppi_00->seq_params).bit_depth = (oxcf->tool_cfg).bit_depth;
  (ppi_00->seq_params).use_highbitdepth = oxcf->use_highbitdepth;
  aVar8 = (oxcf->color_cfg).transfer_characteristics;
  (ppi_00->seq_params).color_primaries = (oxcf->color_cfg).color_primaries;
  (ppi_00->seq_params).transfer_characteristics = aVar8;
  (ppi_00->seq_params).matrix_coefficients = (oxcf->color_cfg).matrix_coefficients;
  (ppi_00->seq_params).monochrome = (oxcf->tool_cfg).enable_monochrome;
  (ppi_00->seq_params).chroma_sample_position = (oxcf->color_cfg).chroma_sample_position;
  (ppi_00->seq_params).color_range = (oxcf->color_cfg).color_range;
  _Var3 = (oxcf->dec_model_cfg).timing_info_present;
  (ppi_00->seq_params).timing_info_present = (uint)_Var3;
  uVar6 = (oxcf->dec_model_cfg).timing_info.time_scale;
  iVar9 = (oxcf->dec_model_cfg).timing_info.equal_picture_interval;
  uVar7 = (oxcf->dec_model_cfg).timing_info.num_ticks_per_picture;
  (ppi_00->seq_params).timing_info.num_units_in_display_tick =
       (oxcf->dec_model_cfg).timing_info.num_units_in_display_tick;
  (ppi_00->seq_params).timing_info.time_scale = uVar6;
  (ppi_00->seq_params).timing_info.equal_picture_interval = iVar9;
  (ppi_00->seq_params).timing_info.num_ticks_per_picture = uVar7;
  (ppi_00->seq_params).display_model_info_present_flag =
       (oxcf->dec_model_cfg).display_model_info_present_flag;
  _Var4 = (oxcf->dec_model_cfg).decoder_model_info_present_flag;
  (ppi_00->seq_params).decoder_model_info_present_flag = _Var4;
  if (_Var4 == true) {
    (ppi_00->seq_params).decoder_model_info.num_units_in_decoding_tick =
         (oxcf->dec_model_cfg).num_units_in_decoding_tick;
    ppi_00->buffer_removal_time_present = true;
    av1_set_aom_dec_model_info(&(ppi_00->seq_params).decoder_model_info);
    av1_set_dec_model_op_parameters((ppi_00->seq_params).op_params);
  }
  else if ((_Var3 == false) || (iVar9 == 0)) {
    (ppi_00->seq_params).op_params[0].initial_display_delay = 10;
  }
  else {
    av1_set_resource_availability_parameters((ppi_00->seq_params).op_params);
  }
  if ((ppi_00->seq_params).monochrome == '\0') {
    if (((((ppi_00->seq_params).color_primaries == AOM_CICP_CP_BT_709) &&
         ((ppi_00->seq_params).transfer_characteristics == AOM_CICP_TC_SRGB)) &&
        ((ppi_00->seq_params).matrix_coefficients == AOM_CICP_MC_IDENTITY)) ||
       (cVar5 = (ppi_00->seq_params).profile, cVar5 == '\x01')) {
      (ppi_00->seq_params).subsampling_x = 0;
    }
    else {
      if (cVar5 == '\0') goto LAB_001b1ec3;
      if ((ppi_00->seq_params).bit_depth == AOM_BITS_12) {
        (ppi_00->seq_params).subsampling_x = (oxcf->input_cfg).chroma_subsampling_x;
        uVar11 = (oxcf->input_cfg).chroma_subsampling_y;
        goto LAB_001b1f37;
      }
      (ppi_00->seq_params).subsampling_x = 1;
    }
    uVar11 = 0;
  }
  else {
LAB_001b1ec3:
    (ppi_00->seq_params).subsampling_x = 1;
    uVar11 = 1;
  }
LAB_001b1f37:
  (ppi_00->seq_params).subsampling_y = uVar11;
  av1_change_config_seq(ppi_00,oxcf,(_Bool *)0x0);
  av1_primary_rc_init(oxcf,&ppi_00->p_rc);
  (ppi_00->p_rc).enable_scenecut_detection = 2;
  if ((ppi_00->lap_enabled != 0) &&
     ((iVar9 = 1, num_lap_buffers - 0x13U < 0xe || (iVar9 = 0, num_lap_buffers < 0x13)))) {
    (ppi_00->p_rc).enable_scenecut_detection = iVar9;
  }
  ppi_00->fn_ptr[0x10].sdf = aom_sad4x16_sse2;
  ppi_00->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
  ppi_00->fn_ptr[0x10].vf = aom_variance4x16_sse2;
  ppi_00->fn_ptr[0x10].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance4x16;
  ppi_00->fn_ptr[0x10].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance4x16;
  ppi_00->fn_ptr[0x10].sdx4df = aom_sad4x16x4d_sse2;
  ppi_00->fn_ptr[0x10].sdx3df = aom_sad4x16x3d_c;
  ppi_00->fn_ptr[0x11].sdf = aom_sad16x4_sse2;
  ppi_00->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
  ppi_00->fn_ptr[0x11].vf = aom_variance16x4;
  ppi_00->fn_ptr[0x11].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance16x4;
  ppi_00->fn_ptr[0x11].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance16x4;
  ppi_00->fn_ptr[0x11].sdx4df = (aom_sad_multi_d_fn_t)aom_sad16x4x4d;
  ppi_00->fn_ptr[0x11].sdx3df = (aom_sad_multi_d_fn_t)aom_sad16x4x3d;
  ppi_00->fn_ptr[0x12].sdf = aom_sad8x32_sse2;
  ppi_00->fn_ptr[0x12].sdaf = aom_sad8x32_avg_sse2;
  ppi_00->fn_ptr[0x12].vf = aom_variance8x32_sse2;
  ppi_00->fn_ptr[0x12].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance8x32;
  ppi_00->fn_ptr[0x12].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance8x32;
  ppi_00->fn_ptr[0x12].sdx4df = aom_sad8x32x4d_sse2;
  ppi_00->fn_ptr[0x12].sdx3df = aom_sad8x32x3d_c;
  ppi_00->fn_ptr[0x13].sdf = aom_sad32x8_sse2;
  ppi_00->fn_ptr[0x13].sdaf = aom_sad32x8_avg_sse2;
  ppi_00->fn_ptr[0x13].vf = aom_variance32x8;
  ppi_00->fn_ptr[0x13].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance32x8;
  ppi_00->fn_ptr[0x13].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance32x8;
  ppi_00->fn_ptr[0x13].sdx4df = (aom_sad_multi_d_fn_t)aom_sad32x8x4d;
  ppi_00->fn_ptr[0x13].sdx3df = (aom_sad_multi_d_fn_t)aom_sad32x8x3d;
  ppi_00->fn_ptr[0x14].sdf = aom_sad16x64_sse2;
  ppi_00->fn_ptr[0x14].sdaf = aom_sad16x64_avg_sse2;
  ppi_00->fn_ptr[0x14].vf = aom_variance16x64;
  ppi_00->fn_ptr[0x14].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance16x64;
  ppi_00->fn_ptr[0x14].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance16x64;
  ppi_00->fn_ptr[0x14].sdx4df = (aom_sad_multi_d_fn_t)aom_sad16x64x4d;
  ppi_00->fn_ptr[0x14].sdx3df = (aom_sad_multi_d_fn_t)aom_sad16x64x3d;
  ppi_00->fn_ptr[0x15].sdf = aom_sad64x16_sse2;
  ppi_00->fn_ptr[0x15].sdaf = aom_sad64x16_avg_sse2;
  ppi_00->fn_ptr[0x15].vf = aom_variance64x16;
  ppi_00->fn_ptr[0x15].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance64x16;
  ppi_00->fn_ptr[0x15].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance64x16;
  ppi_00->fn_ptr[0x15].sdx4df = (aom_sad_multi_d_fn_t)aom_sad64x16x4d;
  ppi_00->fn_ptr[0x15].sdx3df = (aom_sad_multi_d_fn_t)aom_sad64x16x3d;
  ppi_00->fn_ptr[0xf].sdf = aom_sad128x128;
  ppi_00->fn_ptr[0xf].sdaf = aom_sad128x128_avg;
  ppi_00->fn_ptr[0xf].vf = aom_variance128x128;
  ppi_00->fn_ptr[0xf].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance128x128;
  ppi_00->fn_ptr[0xf].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance128x128;
  ppi_00->fn_ptr[0xf].sdx4df = (aom_sad_multi_d_fn_t)aom_sad128x128x4d;
  ppi_00->fn_ptr[0xf].sdx3df = (aom_sad_multi_d_fn_t)aom_sad128x128x3d;
  ppi_00->fn_ptr[0xe].sdf = aom_sad128x64;
  ppi_00->fn_ptr[0xe].sdaf = aom_sad128x64_avg;
  ppi_00->fn_ptr[0xe].vf = aom_variance128x64;
  ppi_00->fn_ptr[0xe].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance128x64;
  ppi_00->fn_ptr[0xe].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance128x64;
  ppi_00->fn_ptr[0xe].sdx4df = (aom_sad_multi_d_fn_t)aom_sad128x64x4d;
  ppi_00->fn_ptr[0xe].sdx3df = (aom_sad_multi_d_fn_t)aom_sad128x64x3d;
  ppi_00->fn_ptr[0xd].sdf = aom_sad64x128;
  ppi_00->fn_ptr[0xd].sdaf = aom_sad64x128_avg;
  ppi_00->fn_ptr[0xd].vf = aom_variance64x128;
  ppi_00->fn_ptr[0xd].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance64x128;
  ppi_00->fn_ptr[0xd].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance64x128;
  ppi_00->fn_ptr[0xd].sdx4df = (aom_sad_multi_d_fn_t)aom_sad64x128x4d;
  ppi_00->fn_ptr[0xd].sdx3df = (aom_sad_multi_d_fn_t)aom_sad64x128x3d;
  ppi_00->fn_ptr[8].sdf = aom_sad32x16;
  ppi_00->fn_ptr[8].sdaf = aom_sad32x16_avg;
  ppi_00->fn_ptr[8].vf = aom_variance32x16;
  ppi_00->fn_ptr[8].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance32x16;
  ppi_00->fn_ptr[8].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance32x16;
  ppi_00->fn_ptr[8].sdx4df = (aom_sad_multi_d_fn_t)aom_sad32x16x4d;
  ppi_00->fn_ptr[8].sdx3df = (aom_sad_multi_d_fn_t)aom_sad32x16x3d;
  ppi_00->fn_ptr[7].sdf = aom_sad16x32_sse2;
  ppi_00->fn_ptr[7].sdaf = aom_sad16x32_avg_sse2;
  ppi_00->fn_ptr[7].vf = aom_variance16x32;
  ppi_00->fn_ptr[7].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance16x32;
  ppi_00->fn_ptr[7].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance16x32;
  ppi_00->fn_ptr[7].sdx4df = (aom_sad_multi_d_fn_t)aom_sad16x32x4d;
  ppi_00->fn_ptr[7].sdx3df = (aom_sad_multi_d_fn_t)aom_sad16x32x3d;
  ppi_00->fn_ptr[0xb].sdf = aom_sad64x32;
  ppi_00->fn_ptr[0xb].sdaf = aom_sad64x32_avg;
  ppi_00->fn_ptr[0xb].vf = aom_variance64x32;
  ppi_00->fn_ptr[0xb].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance64x32;
  ppi_00->fn_ptr[0xb].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance64x32;
  ppi_00->fn_ptr[0xb].sdx4df = (aom_sad_multi_d_fn_t)aom_sad64x32x4d;
  ppi_00->fn_ptr[0xb].sdx3df = (aom_sad_multi_d_fn_t)aom_sad64x32x3d;
  ppi_00->fn_ptr[10].sdf = aom_sad32x64;
  ppi_00->fn_ptr[10].sdaf = aom_sad32x64_avg;
  ppi_00->fn_ptr[10].vf = aom_variance32x64;
  ppi_00->fn_ptr[10].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance32x64;
  ppi_00->fn_ptr[10].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance32x64;
  ppi_00->fn_ptr[10].sdx4df = (aom_sad_multi_d_fn_t)aom_sad32x64x4d;
  ppi_00->fn_ptr[10].sdx3df = (aom_sad_multi_d_fn_t)aom_sad32x64x3d;
  ppi_00->fn_ptr[9].sdf = aom_sad32x32;
  ppi_00->fn_ptr[9].sdaf = aom_sad32x32_avg;
  ppi_00->fn_ptr[9].vf = aom_variance32x32;
  ppi_00->fn_ptr[9].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance32x32;
  ppi_00->fn_ptr[9].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance32x32;
  ppi_00->fn_ptr[9].sdx4df = (aom_sad_multi_d_fn_t)aom_sad32x32x4d;
  ppi_00->fn_ptr[9].sdx3df = (aom_sad_multi_d_fn_t)aom_sad32x32x3d;
  ppi_00->fn_ptr[0xc].sdf = aom_sad64x64;
  ppi_00->fn_ptr[0xc].sdaf = aom_sad64x64_avg;
  ppi_00->fn_ptr[0xc].vf = aom_variance64x64;
  ppi_00->fn_ptr[0xc].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance64x64;
  ppi_00->fn_ptr[0xc].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance64x64;
  ppi_00->fn_ptr[0xc].sdx4df = (aom_sad_multi_d_fn_t)aom_sad64x64x4d;
  ppi_00->fn_ptr[0xc].sdx3df = (aom_sad_multi_d_fn_t)aom_sad64x64x3d;
  ppi_00->fn_ptr[6].sdf = aom_sad16x16_sse2;
  ppi_00->fn_ptr[6].sdaf = aom_sad16x16_avg_sse2;
  ppi_00->fn_ptr[6].vf = aom_variance16x16;
  ppi_00->fn_ptr[6].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance16x16;
  ppi_00->fn_ptr[6].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance16x16;
  ppi_00->fn_ptr[6].sdx4df = (aom_sad_multi_d_fn_t)aom_sad16x16x4d;
  ppi_00->fn_ptr[6].sdx3df = (aom_sad_multi_d_fn_t)aom_sad16x16x3d;
  ppi_00->fn_ptr[5].sdf = aom_sad16x8_sse2;
  ppi_00->fn_ptr[5].sdaf = aom_sad16x8_avg_sse2;
  ppi_00->fn_ptr[5].vf = aom_variance16x8;
  ppi_00->fn_ptr[5].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance16x8;
  ppi_00->fn_ptr[5].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance16x8;
  ppi_00->fn_ptr[5].sdx4df = (aom_sad_multi_d_fn_t)aom_sad16x8x4d;
  ppi_00->fn_ptr[5].sdx3df = (aom_sad_multi_d_fn_t)aom_sad16x8x3d;
  ppi_00->fn_ptr[4].sdf = aom_sad8x16_sse2;
  ppi_00->fn_ptr[4].sdaf = aom_sad8x16_avg_sse2;
  ppi_00->fn_ptr[4].vf = aom_variance8x16_sse2;
  ppi_00->fn_ptr[4].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance8x16;
  ppi_00->fn_ptr[4].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance8x16;
  ppi_00->fn_ptr[4].sdx4df = aom_sad8x16x4d_sse2;
  ppi_00->fn_ptr[4].sdx3df = aom_sad8x16x3d_c;
  ppi_00->fn_ptr[3].sdf = aom_sad8x8_sse2;
  ppi_00->fn_ptr[3].sdaf = aom_sad8x8_avg_sse2;
  ppi_00->fn_ptr[3].vf = aom_variance8x8_sse2;
  ppi_00->fn_ptr[3].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance8x8;
  ppi_00->fn_ptr[3].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance8x8;
  ppi_00->fn_ptr[3].sdx4df = aom_sad8x8x4d_sse2;
  ppi_00->fn_ptr[3].sdx3df = aom_sad8x8x3d_c;
  ppi_00->fn_ptr[2].sdf = aom_sad8x4_sse2;
  ppi_00->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
  ppi_00->fn_ptr[2].vf = aom_variance8x4_sse2;
  ppi_00->fn_ptr[2].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance8x4;
  ppi_00->fn_ptr[2].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance8x4;
  ppi_00->fn_ptr[2].sdx4df = aom_sad8x4x4d_sse2;
  ppi_00->fn_ptr[2].sdx3df = aom_sad8x4x3d_c;
  ppi_00->fn_ptr[1].sdf = aom_sad4x8_sse2;
  ppi_00->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
  ppi_00->fn_ptr[1].vf = aom_variance4x8_sse2;
  ppi_00->fn_ptr[1].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance4x8;
  ppi_00->fn_ptr[1].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance4x8;
  ppi_00->fn_ptr[1].sdx4df = aom_sad4x8x4d_sse2;
  ppi_00->fn_ptr[1].sdx3df = aom_sad4x8x3d_c;
  ppi_00->fn_ptr[0].sdf = aom_sad4x4_sse2;
  ppi_00->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
  ppi_00->fn_ptr[0].vf = aom_variance4x4_sse2;
  ppi_00->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_sub_pixel_variance4x4;
  ppi_00->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_sub_pixel_avg_variance4x4;
  ppi_00->fn_ptr[0].sdx4df = aom_sad4x4x4d_sse2;
  ppi_00->fn_ptr[0].sdx3df = aom_sad4x4x3d_c;
  ppi_00->fn_ptr[0xf].osdf = aom_obmc_sad128x128;
  ppi_00->fn_ptr[0xf].ovf = aom_obmc_variance128x128;
  ppi_00->fn_ptr[0xf].osvf = aom_obmc_sub_pixel_variance128x128;
  ppi_00->fn_ptr[0xe].osdf = aom_obmc_sad128x64;
  ppi_00->fn_ptr[0xe].ovf = aom_obmc_variance128x64;
  ppi_00->fn_ptr[0xe].osvf = aom_obmc_sub_pixel_variance128x64;
  ppi_00->fn_ptr[0xd].osdf = aom_obmc_sad64x128;
  ppi_00->fn_ptr[0xd].ovf = aom_obmc_variance64x128;
  ppi_00->fn_ptr[0xd].osvf = aom_obmc_sub_pixel_variance64x128;
  ppi_00->fn_ptr[0xc].osdf = aom_obmc_sad64x64;
  ppi_00->fn_ptr[0xc].ovf = aom_obmc_variance64x64;
  ppi_00->fn_ptr[0xc].osvf = aom_obmc_sub_pixel_variance64x64;
  ppi_00->fn_ptr[0xb].osdf = aom_obmc_sad64x32;
  ppi_00->fn_ptr[0xb].ovf = aom_obmc_variance64x32;
  ppi_00->fn_ptr[0xb].osvf = aom_obmc_sub_pixel_variance64x32;
  ppi_00->fn_ptr[10].osdf = aom_obmc_sad32x64;
  ppi_00->fn_ptr[10].ovf = aom_obmc_variance32x64;
  ppi_00->fn_ptr[10].osvf = aom_obmc_sub_pixel_variance32x64;
  ppi_00->fn_ptr[9].osdf = aom_obmc_sad32x32;
  ppi_00->fn_ptr[9].ovf = aom_obmc_variance32x32;
  ppi_00->fn_ptr[9].osvf = aom_obmc_sub_pixel_variance32x32;
  ppi_00->fn_ptr[8].osdf = aom_obmc_sad32x16;
  ppi_00->fn_ptr[8].ovf = aom_obmc_variance32x16;
  ppi_00->fn_ptr[8].osvf = aom_obmc_sub_pixel_variance32x16;
  ppi_00->fn_ptr[7].osdf = aom_obmc_sad16x32;
  ppi_00->fn_ptr[7].ovf = aom_obmc_variance16x32;
  ppi_00->fn_ptr[7].osvf = aom_obmc_sub_pixel_variance16x32;
  ppi_00->fn_ptr[6].osdf = aom_obmc_sad16x16;
  ppi_00->fn_ptr[6].ovf = aom_obmc_variance16x16;
  ppi_00->fn_ptr[6].osvf = aom_obmc_sub_pixel_variance16x16;
  ppi_00->fn_ptr[5].osdf = aom_obmc_sad16x8;
  ppi_00->fn_ptr[5].ovf = aom_obmc_variance16x8;
  ppi_00->fn_ptr[5].osvf = aom_obmc_sub_pixel_variance16x8;
  ppi_00->fn_ptr[4].osdf = aom_obmc_sad8x16;
  ppi_00->fn_ptr[4].ovf = aom_obmc_variance8x16;
  ppi_00->fn_ptr[4].osvf = aom_obmc_sub_pixel_variance8x16;
  ppi_00->fn_ptr[3].osdf = aom_obmc_sad8x8;
  ppi_00->fn_ptr[3].ovf = aom_obmc_variance8x8;
  ppi_00->fn_ptr[3].osvf = aom_obmc_sub_pixel_variance8x8;
  ppi_00->fn_ptr[1].osdf = aom_obmc_sad4x8;
  ppi_00->fn_ptr[1].ovf = aom_obmc_variance4x8;
  ppi_00->fn_ptr[1].osvf = aom_obmc_sub_pixel_variance4x8;
  ppi_00->fn_ptr[2].osdf = aom_obmc_sad8x4;
  ppi_00->fn_ptr[2].ovf = aom_obmc_variance8x4;
  ppi_00->fn_ptr[2].osvf = aom_obmc_sub_pixel_variance8x4;
  ppi_00->fn_ptr[0].osdf = aom_obmc_sad4x4;
  ppi_00->fn_ptr[0].ovf = aom_obmc_variance4x4;
  ppi_00->fn_ptr[0].osvf = aom_obmc_sub_pixel_variance4x4;
  ppi_00->fn_ptr[0x10].osdf = aom_obmc_sad4x16;
  ppi_00->fn_ptr[0x10].ovf = aom_obmc_variance4x16;
  ppi_00->fn_ptr[0x10].osvf = aom_obmc_sub_pixel_variance4x16;
  ppi_00->fn_ptr[0x11].osdf = aom_obmc_sad16x4;
  ppi_00->fn_ptr[0x11].ovf = aom_obmc_variance16x4;
  ppi_00->fn_ptr[0x11].osvf = aom_obmc_sub_pixel_variance16x4;
  ppi_00->fn_ptr[0x12].osdf = aom_obmc_sad8x32;
  ppi_00->fn_ptr[0x12].ovf = aom_obmc_variance8x32;
  ppi_00->fn_ptr[0x12].osvf = aom_obmc_sub_pixel_variance8x32;
  ppi_00->fn_ptr[0x13].osdf = aom_obmc_sad32x8;
  ppi_00->fn_ptr[0x13].ovf = aom_obmc_variance32x8;
  ppi_00->fn_ptr[0x13].osvf = aom_obmc_sub_pixel_variance32x8;
  ppi_00->fn_ptr[0x14].osdf = aom_obmc_sad16x64;
  ppi_00->fn_ptr[0x14].ovf = aom_obmc_variance16x64;
  ppi_00->fn_ptr[0x14].osvf = aom_obmc_sub_pixel_variance16x64;
  ppi_00->fn_ptr[0x15].osdf = aom_obmc_sad64x16;
  ppi_00->fn_ptr[0x15].ovf = aom_obmc_variance64x16;
  ppi_00->fn_ptr[0x15].osvf = aom_obmc_sub_pixel_variance64x16;
  ppi_00->fn_ptr[0xf].msdf = aom_masked_sad128x128;
  ppi_00->fn_ptr[0xf].msvf = aom_masked_sub_pixel_variance128x128;
  ppi_00->fn_ptr[0xe].msdf = aom_masked_sad128x64;
  ppi_00->fn_ptr[0xe].msvf = aom_masked_sub_pixel_variance128x64;
  ppi_00->fn_ptr[0xd].msdf = aom_masked_sad64x128;
  ppi_00->fn_ptr[0xd].msvf = aom_masked_sub_pixel_variance64x128;
  ppi_00->fn_ptr[0xc].msdf = aom_masked_sad64x64;
  ppi_00->fn_ptr[0xc].msvf = aom_masked_sub_pixel_variance64x64;
  ppi_00->fn_ptr[0xb].msdf = aom_masked_sad64x32;
  ppi_00->fn_ptr[0xb].msvf = aom_masked_sub_pixel_variance64x32;
  ppi_00->fn_ptr[10].msdf = aom_masked_sad32x64;
  ppi_00->fn_ptr[10].msvf = aom_masked_sub_pixel_variance32x64;
  ppi_00->fn_ptr[9].msdf = aom_masked_sad32x32;
  ppi_00->fn_ptr[9].msvf = aom_masked_sub_pixel_variance32x32;
  ppi_00->fn_ptr[8].msdf = aom_masked_sad32x16;
  ppi_00->fn_ptr[8].msvf = aom_masked_sub_pixel_variance32x16;
  ppi_00->fn_ptr[7].msdf = aom_masked_sad16x32;
  ppi_00->fn_ptr[7].msvf = aom_masked_sub_pixel_variance16x32;
  ppi_00->fn_ptr[6].msdf = aom_masked_sad16x16;
  ppi_00->fn_ptr[6].msvf = aom_masked_sub_pixel_variance16x16;
  ppi_00->fn_ptr[5].msdf = aom_masked_sad16x8;
  ppi_00->fn_ptr[5].msvf = aom_masked_sub_pixel_variance16x8;
  ppi_00->fn_ptr[4].msdf = aom_masked_sad8x16;
  ppi_00->fn_ptr[4].msvf = aom_masked_sub_pixel_variance8x16;
  ppi_00->fn_ptr[3].msdf = aom_masked_sad8x8;
  ppi_00->fn_ptr[3].msvf = aom_masked_sub_pixel_variance8x8;
  ppi_00->fn_ptr[1].msdf = aom_masked_sad4x8;
  ppi_00->fn_ptr[1].msvf = aom_masked_sub_pixel_variance4x8;
  ppi_00->fn_ptr[2].msdf = aom_masked_sad8x4;
  ppi_00->fn_ptr[2].msvf = aom_masked_sub_pixel_variance8x4;
  ppi_00->fn_ptr[0].msdf = aom_masked_sad4x4;
  ppi_00->fn_ptr[0].msvf = aom_masked_sub_pixel_variance4x4;
  ppi_00->fn_ptr[0x10].msdf = aom_masked_sad4x16;
  ppi_00->fn_ptr[0x10].msvf = aom_masked_sub_pixel_variance4x16;
  ppi_00->fn_ptr[0x11].msdf = aom_masked_sad16x4;
  ppi_00->fn_ptr[0x11].msvf = aom_masked_sub_pixel_variance16x4;
  ppi_00->fn_ptr[0x12].msdf = aom_masked_sad8x32;
  ppi_00->fn_ptr[0x12].msvf = aom_masked_sub_pixel_variance8x32;
  ppi_00->fn_ptr[0x13].msdf = aom_masked_sad32x8;
  ppi_00->fn_ptr[0x13].msvf = aom_masked_sub_pixel_variance32x8;
  ppi_00->fn_ptr[0x14].msdf = aom_masked_sad16x64;
  ppi_00->fn_ptr[0x14].msvf = aom_masked_sub_pixel_variance16x64;
  ppi_00->fn_ptr[0x15].msdf = aom_masked_sad64x16;
  ppi_00->fn_ptr[0x15].msvf = aom_masked_sub_pixel_variance64x16;
  ppi_00->fn_ptr[0xf].sdsf = aom_sad_skip_128x128;
  ppi_00->fn_ptr[0xf].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_128x128x4d;
  ppi_00->fn_ptr[0xe].sdsf = aom_sad_skip_128x64;
  ppi_00->fn_ptr[0xe].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_128x64x4d;
  ppi_00->fn_ptr[0xd].sdsf = aom_sad_skip_64x128;
  ppi_00->fn_ptr[0xd].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_64x128x4d;
  ppi_00->fn_ptr[0xc].sdsf = aom_sad_skip_64x64;
  ppi_00->fn_ptr[0xc].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_64x64x4d;
  ppi_00->fn_ptr[0xb].sdsf = aom_sad_skip_64x32;
  ppi_00->fn_ptr[0xb].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_64x32x4d;
  ppi_00->fn_ptr[10].sdsf = aom_sad_skip_32x64;
  ppi_00->fn_ptr[10].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_32x64x4d;
  ppi_00->fn_ptr[9].sdsf = aom_sad_skip_32x32;
  ppi_00->fn_ptr[9].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_32x32x4d;
  ppi_00->fn_ptr[8].sdsf = aom_sad_skip_32x16;
  ppi_00->fn_ptr[8].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_32x16x4d;
  ppi_00->fn_ptr[7].sdsf = aom_sad_skip_16x32_sse2;
  ppi_00->fn_ptr[7].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_16x32x4d;
  ppi_00->fn_ptr[6].sdsf = aom_sad_skip_16x16_sse2;
  ppi_00->fn_ptr[6].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_16x16x4d;
  ppi_00->fn_ptr[4].sdsf = aom_sad_skip_8x16_sse2;
  ppi_00->fn_ptr[4].sdsx4df = aom_sad_skip_8x16x4d_sse2;
  ppi_00->fn_ptr[0x15].sdsf = aom_sad_skip_64x16_sse2;
  ppi_00->fn_ptr[0x15].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_64x16x4d;
  ppi_00->fn_ptr[0x14].sdsf = aom_sad_skip_16x64_sse2;
  ppi_00->fn_ptr[0x14].sdsx4df = (aom_sad_multi_d_fn_t)aom_sad_skip_16x64x4d;
  ppi_00->fn_ptr[0x12].sdsf = aom_sad_skip_8x32_sse2;
  ppi_00->fn_ptr[0x12].sdsx4df = aom_sad_skip_8x32x4d_sse2;
  ppi_00->fn_ptr[0x10].sdsf = aom_sad_skip_4x16_sse2;
  ppi_00->fn_ptr[0x10].sdsx4df = aom_sad_skip_4x16x4d_sse2;
  highbd_set_var_fns(ppi_00);
  uVar1 = (oxcf->frm_dim_cfg).width;
  uVar2 = (oxcf->frm_dim_cfg).height;
  uVar11 = (uVar1 + 7 >> 2 & 0xfffffffeU) + 3;
  uVar12 = (uVar2 + 7 >> 2 & 0xfffffffeU) + 3;
  pdVar10 = (double *)
            aom_calloc((long)(((int)((uVar12 >> 0x1e) + uVar12) >> 2) *
                             ((int)((uVar11 >> 0x1e) + uVar11) >> 2)),8);
  ppi_00->tpl_sb_rdmult_scaling_factors = pdVar10;
  if (ppi_00->tpl_sb_rdmult_scaling_factors == (double *)0x0) {
    aom_internal_error(&ppi_00->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate ppi->tpl_sb_rdmult_scaling_factors");
  }
  (ppi_00->error).setjmp = 0;
  return ppi_00;
}

Assistant:

AV1_PRIMARY *av1_create_primary_compressor(
    struct aom_codec_pkt_list *pkt_list_head, int num_lap_buffers,
    const AV1EncoderConfig *oxcf) {
  AV1_PRIMARY *volatile const ppi = aom_memalign(32, sizeof(AV1_PRIMARY));
  if (!ppi) return NULL;
  av1_zero(*ppi);

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(ppi->error.jmp)) {
    ppi->error.setjmp = 0;
    av1_remove_primary_compressor(ppi);
    return 0;
  }
  ppi->error.setjmp = 1;

  ppi->seq_params_locked = 0;
  ppi->lap_enabled = num_lap_buffers > 0;
  ppi->output_pkt_list = pkt_list_head;
  ppi->b_calculate_psnr = CONFIG_INTERNAL_STATS;
  ppi->frames_left = oxcf->input_cfg.limit;
  ppi->num_fp_contexts = 1;

  init_config_sequence(ppi, oxcf);

#if CONFIG_ENTROPY_STATS
  av1_zero(ppi->aggregate_fc);
#endif  // CONFIG_ENTROPY_STATS

  av1_primary_rc_init(oxcf, &ppi->p_rc);

  // For two pass and lag_in_frames > 33 in LAP.
  ppi->p_rc.enable_scenecut_detection = ENABLE_SCENECUT_MODE_2;
  if (ppi->lap_enabled) {
    if ((num_lap_buffers <
         (MAX_GF_LENGTH_LAP + SCENE_CUT_KEY_TEST_INTERVAL + 1)) &&
        num_lap_buffers >= (MAX_GF_LENGTH_LAP + 3)) {
      /*
       * For lag in frames >= 19 and <33, enable scenecut
       * with limited future frame prediction.
       */
      ppi->p_rc.enable_scenecut_detection = ENABLE_SCENECUT_MODE_1;
    } else if (num_lap_buffers < (MAX_GF_LENGTH_LAP + 3)) {
      // Disable scenecut when lag_in_frames < 19.
      ppi->p_rc.enable_scenecut_detection = DISABLE_SCENECUT;
    }
  }

#define BFP(BT, SDF, SDAF, VF, SVF, SVAF, SDX4DF, SDX3DF) \
  ppi->fn_ptr[BT].sdf = SDF;                              \
  ppi->fn_ptr[BT].sdaf = SDAF;                            \
  ppi->fn_ptr[BT].vf = VF;                                \
  ppi->fn_ptr[BT].svf = SVF;                              \
  ppi->fn_ptr[BT].svaf = SVAF;                            \
  ppi->fn_ptr[BT].sdx4df = SDX4DF;                        \
  ppi->fn_ptr[BT].sdx3df = SDX3DF;

// Realtime mode doesn't use 4x rectangular blocks.
#if !CONFIG_REALTIME_ONLY
  // sdaf (used in compound prediction, get_mvpred_compound_sad()) is unused
  // for 4xN and Nx4 blocks.
  BFP(BLOCK_4X16, aom_sad4x16, /*SDAF=*/NULL, aom_variance4x16,
      aom_sub_pixel_variance4x16, aom_sub_pixel_avg_variance4x16,
      aom_sad4x16x4d, aom_sad4x16x3d)

  // sdaf (used in compound prediction, get_mvpred_compound_sad()) is unused
  // for 4xN and Nx4 blocks.
  BFP(BLOCK_16X4, aom_sad16x4, /*SDAF=*/NULL, aom_variance16x4,
      aom_sub_pixel_variance16x4, aom_sub_pixel_avg_variance16x4,
      aom_sad16x4x4d, aom_sad16x4x3d)

  BFP(BLOCK_8X32, aom_sad8x32, aom_sad8x32_avg, aom_variance8x32,
      aom_sub_pixel_variance8x32, aom_sub_pixel_avg_variance8x32,
      aom_sad8x32x4d, aom_sad8x32x3d)

  BFP(BLOCK_32X8, aom_sad32x8, aom_sad32x8_avg, aom_variance32x8,
      aom_sub_pixel_variance32x8, aom_sub_pixel_avg_variance32x8,
      aom_sad32x8x4d, aom_sad32x8x3d)

  BFP(BLOCK_16X64, aom_sad16x64, aom_sad16x64_avg, aom_variance16x64,
      aom_sub_pixel_variance16x64, aom_sub_pixel_avg_variance16x64,
      aom_sad16x64x4d, aom_sad16x64x3d)

  BFP(BLOCK_64X16, aom_sad64x16, aom_sad64x16_avg, aom_variance64x16,
      aom_sub_pixel_variance64x16, aom_sub_pixel_avg_variance64x16,
      aom_sad64x16x4d, aom_sad64x16x3d)
#endif  // !CONFIG_REALTIME_ONLY

  BFP(BLOCK_128X128, aom_sad128x128, aom_sad128x128_avg, aom_variance128x128,
      aom_sub_pixel_variance128x128, aom_sub_pixel_avg_variance128x128,
      aom_sad128x128x4d, aom_sad128x128x3d)

  BFP(BLOCK_128X64, aom_sad128x64, aom_sad128x64_avg, aom_variance128x64,
      aom_sub_pixel_variance128x64, aom_sub_pixel_avg_variance128x64,
      aom_sad128x64x4d, aom_sad128x64x3d)

  BFP(BLOCK_64X128, aom_sad64x128, aom_sad64x128_avg, aom_variance64x128,
      aom_sub_pixel_variance64x128, aom_sub_pixel_avg_variance64x128,
      aom_sad64x128x4d, aom_sad64x128x3d)

  BFP(BLOCK_32X16, aom_sad32x16, aom_sad32x16_avg, aom_variance32x16,
      aom_sub_pixel_variance32x16, aom_sub_pixel_avg_variance32x16,
      aom_sad32x16x4d, aom_sad32x16x3d)

  BFP(BLOCK_16X32, aom_sad16x32, aom_sad16x32_avg, aom_variance16x32,
      aom_sub_pixel_variance16x32, aom_sub_pixel_avg_variance16x32,
      aom_sad16x32x4d, aom_sad16x32x3d)

  BFP(BLOCK_64X32, aom_sad64x32, aom_sad64x32_avg, aom_variance64x32,
      aom_sub_pixel_variance64x32, aom_sub_pixel_avg_variance64x32,
      aom_sad64x32x4d, aom_sad64x32x3d)

  BFP(BLOCK_32X64, aom_sad32x64, aom_sad32x64_avg, aom_variance32x64,
      aom_sub_pixel_variance32x64, aom_sub_pixel_avg_variance32x64,
      aom_sad32x64x4d, aom_sad32x64x3d)

  BFP(BLOCK_32X32, aom_sad32x32, aom_sad32x32_avg, aom_variance32x32,
      aom_sub_pixel_variance32x32, aom_sub_pixel_avg_variance32x32,
      aom_sad32x32x4d, aom_sad32x32x3d)

  BFP(BLOCK_64X64, aom_sad64x64, aom_sad64x64_avg, aom_variance64x64,
      aom_sub_pixel_variance64x64, aom_sub_pixel_avg_variance64x64,
      aom_sad64x64x4d, aom_sad64x64x3d)

  BFP(BLOCK_16X16, aom_sad16x16, aom_sad16x16_avg, aom_variance16x16,
      aom_sub_pixel_variance16x16, aom_sub_pixel_avg_variance16x16,
      aom_sad16x16x4d, aom_sad16x16x3d)

  BFP(BLOCK_16X8, aom_sad16x8, aom_sad16x8_avg, aom_variance16x8,
      aom_sub_pixel_variance16x8, aom_sub_pixel_avg_variance16x8,
      aom_sad16x8x4d, aom_sad16x8x3d)

  BFP(BLOCK_8X16, aom_sad8x16, aom_sad8x16_avg, aom_variance8x16,
      aom_sub_pixel_variance8x16, aom_sub_pixel_avg_variance8x16,
      aom_sad8x16x4d, aom_sad8x16x3d)

  BFP(BLOCK_8X8, aom_sad8x8, aom_sad8x8_avg, aom_variance8x8,
      aom_sub_pixel_variance8x8, aom_sub_pixel_avg_variance8x8, aom_sad8x8x4d,
      aom_sad8x8x3d)

  // sdaf (used in compound prediction, get_mvpred_compound_sad()) is unused
  // for 4xN and Nx4 blocks.
  BFP(BLOCK_8X4, aom_sad8x4, /*SDAF=*/NULL, aom_variance8x4,
      aom_sub_pixel_variance8x4, aom_sub_pixel_avg_variance8x4, aom_sad8x4x4d,
      aom_sad8x4x3d)

  // sdaf (used in compound prediction, get_mvpred_compound_sad()) is unused
  // for 4xN and Nx4 blocks.
  BFP(BLOCK_4X8, aom_sad4x8, /*SDAF=*/NULL, aom_variance4x8,
      aom_sub_pixel_variance4x8, aom_sub_pixel_avg_variance4x8, aom_sad4x8x4d,
      aom_sad4x8x3d)

  // sdaf (used in compound prediction, get_mvpred_compound_sad()) is unused
  // for 4xN and Nx4 blocks.
  BFP(BLOCK_4X4, aom_sad4x4, /*SDAF=*/NULL, aom_variance4x4,
      aom_sub_pixel_variance4x4, aom_sub_pixel_avg_variance4x4, aom_sad4x4x4d,
      aom_sad4x4x3d)

#if !CONFIG_REALTIME_ONLY
#define OBFP(BT, OSDF, OVF, OSVF) \
  ppi->fn_ptr[BT].osdf = OSDF;    \
  ppi->fn_ptr[BT].ovf = OVF;      \
  ppi->fn_ptr[BT].osvf = OSVF;

  OBFP(BLOCK_128X128, aom_obmc_sad128x128, aom_obmc_variance128x128,
       aom_obmc_sub_pixel_variance128x128)
  OBFP(BLOCK_128X64, aom_obmc_sad128x64, aom_obmc_variance128x64,
       aom_obmc_sub_pixel_variance128x64)
  OBFP(BLOCK_64X128, aom_obmc_sad64x128, aom_obmc_variance64x128,
       aom_obmc_sub_pixel_variance64x128)
  OBFP(BLOCK_64X64, aom_obmc_sad64x64, aom_obmc_variance64x64,
       aom_obmc_sub_pixel_variance64x64)
  OBFP(BLOCK_64X32, aom_obmc_sad64x32, aom_obmc_variance64x32,
       aom_obmc_sub_pixel_variance64x32)
  OBFP(BLOCK_32X64, aom_obmc_sad32x64, aom_obmc_variance32x64,
       aom_obmc_sub_pixel_variance32x64)
  OBFP(BLOCK_32X32, aom_obmc_sad32x32, aom_obmc_variance32x32,
       aom_obmc_sub_pixel_variance32x32)
  OBFP(BLOCK_32X16, aom_obmc_sad32x16, aom_obmc_variance32x16,
       aom_obmc_sub_pixel_variance32x16)
  OBFP(BLOCK_16X32, aom_obmc_sad16x32, aom_obmc_variance16x32,
       aom_obmc_sub_pixel_variance16x32)
  OBFP(BLOCK_16X16, aom_obmc_sad16x16, aom_obmc_variance16x16,
       aom_obmc_sub_pixel_variance16x16)
  OBFP(BLOCK_16X8, aom_obmc_sad16x8, aom_obmc_variance16x8,
       aom_obmc_sub_pixel_variance16x8)
  OBFP(BLOCK_8X16, aom_obmc_sad8x16, aom_obmc_variance8x16,
       aom_obmc_sub_pixel_variance8x16)
  OBFP(BLOCK_8X8, aom_obmc_sad8x8, aom_obmc_variance8x8,
       aom_obmc_sub_pixel_variance8x8)
  OBFP(BLOCK_4X8, aom_obmc_sad4x8, aom_obmc_variance4x8,
       aom_obmc_sub_pixel_variance4x8)
  OBFP(BLOCK_8X4, aom_obmc_sad8x4, aom_obmc_variance8x4,
       aom_obmc_sub_pixel_variance8x4)
  OBFP(BLOCK_4X4, aom_obmc_sad4x4, aom_obmc_variance4x4,
       aom_obmc_sub_pixel_variance4x4)
  OBFP(BLOCK_4X16, aom_obmc_sad4x16, aom_obmc_variance4x16,
       aom_obmc_sub_pixel_variance4x16)
  OBFP(BLOCK_16X4, aom_obmc_sad16x4, aom_obmc_variance16x4,
       aom_obmc_sub_pixel_variance16x4)
  OBFP(BLOCK_8X32, aom_obmc_sad8x32, aom_obmc_variance8x32,
       aom_obmc_sub_pixel_variance8x32)
  OBFP(BLOCK_32X8, aom_obmc_sad32x8, aom_obmc_variance32x8,
       aom_obmc_sub_pixel_variance32x8)
  OBFP(BLOCK_16X64, aom_obmc_sad16x64, aom_obmc_variance16x64,
       aom_obmc_sub_pixel_variance16x64)
  OBFP(BLOCK_64X16, aom_obmc_sad64x16, aom_obmc_variance64x16,
       aom_obmc_sub_pixel_variance64x16)
#endif  // !CONFIG_REALTIME_ONLY

#define MBFP(BT, MCSDF, MCSVF)  \
  ppi->fn_ptr[BT].msdf = MCSDF; \
  ppi->fn_ptr[BT].msvf = MCSVF;

  MBFP(BLOCK_128X128, aom_masked_sad128x128,
       aom_masked_sub_pixel_variance128x128)
  MBFP(BLOCK_128X64, aom_masked_sad128x64, aom_masked_sub_pixel_variance128x64)
  MBFP(BLOCK_64X128, aom_masked_sad64x128, aom_masked_sub_pixel_variance64x128)
  MBFP(BLOCK_64X64, aom_masked_sad64x64, aom_masked_sub_pixel_variance64x64)
  MBFP(BLOCK_64X32, aom_masked_sad64x32, aom_masked_sub_pixel_variance64x32)
  MBFP(BLOCK_32X64, aom_masked_sad32x64, aom_masked_sub_pixel_variance32x64)
  MBFP(BLOCK_32X32, aom_masked_sad32x32, aom_masked_sub_pixel_variance32x32)
  MBFP(BLOCK_32X16, aom_masked_sad32x16, aom_masked_sub_pixel_variance32x16)
  MBFP(BLOCK_16X32, aom_masked_sad16x32, aom_masked_sub_pixel_variance16x32)
  MBFP(BLOCK_16X16, aom_masked_sad16x16, aom_masked_sub_pixel_variance16x16)
  MBFP(BLOCK_16X8, aom_masked_sad16x8, aom_masked_sub_pixel_variance16x8)
  MBFP(BLOCK_8X16, aom_masked_sad8x16, aom_masked_sub_pixel_variance8x16)
  MBFP(BLOCK_8X8, aom_masked_sad8x8, aom_masked_sub_pixel_variance8x8)
  MBFP(BLOCK_4X8, aom_masked_sad4x8, aom_masked_sub_pixel_variance4x8)
  MBFP(BLOCK_8X4, aom_masked_sad8x4, aom_masked_sub_pixel_variance8x4)
  MBFP(BLOCK_4X4, aom_masked_sad4x4, aom_masked_sub_pixel_variance4x4)

#if !CONFIG_REALTIME_ONLY
  MBFP(BLOCK_4X16, aom_masked_sad4x16, aom_masked_sub_pixel_variance4x16)
  MBFP(BLOCK_16X4, aom_masked_sad16x4, aom_masked_sub_pixel_variance16x4)
  MBFP(BLOCK_8X32, aom_masked_sad8x32, aom_masked_sub_pixel_variance8x32)
  MBFP(BLOCK_32X8, aom_masked_sad32x8, aom_masked_sub_pixel_variance32x8)
  MBFP(BLOCK_16X64, aom_masked_sad16x64, aom_masked_sub_pixel_variance16x64)
  MBFP(BLOCK_64X16, aom_masked_sad64x16, aom_masked_sub_pixel_variance64x16)
#endif

#define SDSFP(BT, SDSF, SDSX4DF) \
  ppi->fn_ptr[BT].sdsf = SDSF;   \
  ppi->fn_ptr[BT].sdsx4df = SDSX4DF;

  SDSFP(BLOCK_128X128, aom_sad_skip_128x128, aom_sad_skip_128x128x4d)
  SDSFP(BLOCK_128X64, aom_sad_skip_128x64, aom_sad_skip_128x64x4d)
  SDSFP(BLOCK_64X128, aom_sad_skip_64x128, aom_sad_skip_64x128x4d)
  SDSFP(BLOCK_64X64, aom_sad_skip_64x64, aom_sad_skip_64x64x4d)
  SDSFP(BLOCK_64X32, aom_sad_skip_64x32, aom_sad_skip_64x32x4d)

  SDSFP(BLOCK_32X64, aom_sad_skip_32x64, aom_sad_skip_32x64x4d)
  SDSFP(BLOCK_32X32, aom_sad_skip_32x32, aom_sad_skip_32x32x4d)
  SDSFP(BLOCK_32X16, aom_sad_skip_32x16, aom_sad_skip_32x16x4d)

  SDSFP(BLOCK_16X32, aom_sad_skip_16x32, aom_sad_skip_16x32x4d)
  SDSFP(BLOCK_16X16, aom_sad_skip_16x16, aom_sad_skip_16x16x4d)
  SDSFP(BLOCK_8X16, aom_sad_skip_8x16, aom_sad_skip_8x16x4d)

#if !CONFIG_REALTIME_ONLY
  SDSFP(BLOCK_64X16, aom_sad_skip_64x16, aom_sad_skip_64x16x4d)
  SDSFP(BLOCK_16X64, aom_sad_skip_16x64, aom_sad_skip_16x64x4d)
  SDSFP(BLOCK_8X32, aom_sad_skip_8x32, aom_sad_skip_8x32x4d)
  SDSFP(BLOCK_4X16, aom_sad_skip_4x16, aom_sad_skip_4x16x4d)
#endif
#undef SDSFP

#if CONFIG_AV1_HIGHBITDEPTH
  highbd_set_var_fns(ppi);
#endif

  {
    // As cm->mi_params is a part of the frame level context (cpi), it is
    // unavailable at this point. mi_params is created as a local temporary
    // variable, to be passed into the functions used for allocating tpl
    // buffers. The values in this variable are populated according to initial
    // width and height of the frame.
    CommonModeInfoParams mi_params;
    enc_set_mb_mi(&mi_params, oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
                  BLOCK_4X4);

    const BLOCK_SIZE bsize = BLOCK_16X16;
    const int w = mi_size_wide[bsize];
    const int h = mi_size_high[bsize];
    const int num_cols = (mi_params.mi_cols + w - 1) / w;
    const int num_rows = (mi_params.mi_rows + h - 1) / h;
    AOM_CHECK_MEM_ERROR(
        &ppi->error, ppi->tpl_sb_rdmult_scaling_factors,
        aom_calloc(num_rows * num_cols,
                   sizeof(*ppi->tpl_sb_rdmult_scaling_factors)));

#if CONFIG_INTERNAL_STATS
    ppi->b_calculate_blockiness = 1;
    ppi->b_calculate_consistency = 1;

    for (int i = 0; i <= STAT_ALL; i++) {
      ppi->psnr[0].stat[i] = 0;
      ppi->psnr[1].stat[i] = 0;

      ppi->fastssim.stat[i] = 0;
      ppi->psnrhvs.stat[i] = 0;
    }

    ppi->psnr[0].worst = 100.0;
    ppi->psnr[1].worst = 100.0;
    ppi->worst_ssim = 100.0;
    ppi->worst_ssim_hbd = 100.0;

    ppi->count[0] = 0;
    ppi->count[1] = 0;
    ppi->total_bytes = 0;

    if (ppi->b_calculate_psnr) {
      ppi->total_sq_error[0] = 0;
      ppi->total_samples[0] = 0;
      ppi->total_sq_error[1] = 0;
      ppi->total_samples[1] = 0;
      ppi->total_recode_hits = 0;
      ppi->summed_quality = 0;
      ppi->summed_weights = 0;
      ppi->summed_quality_hbd = 0;
      ppi->summed_weights_hbd = 0;
    }

    ppi->fastssim.worst = 100.0;
    ppi->psnrhvs.worst = 100.0;

    if (ppi->b_calculate_blockiness) {
      ppi->total_blockiness = 0;
      ppi->worst_blockiness = 0.0;
    }

    ppi->total_inconsistency = 0;
    ppi->worst_consistency = 100.0;
    if (ppi->b_calculate_consistency) {
      AOM_CHECK_MEM_ERROR(&ppi->error, ppi->ssim_vars,
                          aom_malloc(sizeof(*ppi->ssim_vars) * 4 *
                                     mi_params.mi_rows * mi_params.mi_cols));
    }
#endif
  }

  ppi->error.setjmp = 0;
  return ppi;
}